

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall SchnorrPubkey_TweakTest_Test::TestBody(SchnorrPubkey_TweakTest_Test *this)

{
  char *pcVar1;
  AssertHelper AStack_218;
  AssertionResult gtest_ar;
  string local_200;
  Privkey sk_c;
  string exp_pk_c;
  ByteData256 tweak1;
  SchnorrPubkey pk_b;
  string exp_sk_c;
  Privkey sk_b;
  SchnorrPubkey pk_c2;
  SchnorrPubkey pk_a;
  SchnorrPubkey pk_c12;
  SchnorrPubkey pk_c11;
  SchnorrPubkey pk_c5;
  SchnorrPubkey pk_c4;
  SchnorrPubkey pk_c3;
  SchnorrPubkey pk_c1;
  Pubkey pk;
  Privkey sk_a;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  std::__cxx11::string::string
            ((string *)&sk_b,"1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434",
             (allocator *)&exp_sk_c);
  cfd::core::Privkey::Privkey(&sk_a,(string *)&sk_b,kMainnet,true);
  std::__cxx11::string::~string((string *)&sk_b);
  std::__cxx11::string::string
            ((string *)&exp_sk_c,"353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659",
             (allocator *)&exp_pk_c);
  cfd::core::Privkey::Privkey(&sk_b,&exp_sk_c,kMainnet,true);
  std::__cxx11::string::~string((string *)&exp_sk_c);
  std::__cxx11::string::string
            ((string *)&exp_sk_c,"528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d",
             (allocator *)&exp_pk_c);
  std::__cxx11::string::string
            ((string *)&exp_pk_c,"c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71",
             (allocator *)&sk_c);
  std::__cxx11::string::string
            ((string *)&sk_c,"03c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71",
             (allocator *)&local_200);
  cfd::core::Pubkey::Pubkey(&pk,(string *)&sk_c);
  std::__cxx11::string::~string((string *)&sk_c);
  cfd::core::SchnorrPubkey::FromPrivkey(&pk_a,&sk_a,(bool *)0x0);
  cfd::core::SchnorrPubkey::FromPrivkey(&pk_b,&sk_b,(bool *)0x0);
  cfd::core::SchnorrPubkey::GetData(&sk_c.data_,&pk_b);
  cfd::core::ByteData256::ByteData256(&tweak1,&sk_c.data_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_c);
  cfd::core::operator+(&pk_c1,&pk_a,&tweak1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c2,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_b);
  cfd::core::SchnorrPubkey::operator+=((SchnorrPubkey *)&local_20,&pk_c2,&tweak1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  cfd::core::operator-(&pk_c3,&pk_a,&tweak1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c4,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_b);
  cfd::core::SchnorrPubkey::operator-=((SchnorrPubkey *)&local_38,&pk_c2,&tweak1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  cfd::core::SchnorrPubkey::CreateTweakAdd(&pk_c5,&pk_a,&pk_b,(bool *)0x0);
  cfd::core::operator+(&sk_c,&sk_a,&sk_b);
  cfd::core::SchnorrPubkey::FromPrivkey(&pk_c11,&sk_c,(bool *)0x0);
  cfd::core::SchnorrPubkey::FromPubkey(&pk_c12,&pk,(bool *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_200,&pk_c1);
  testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_pk_c","pk_c1.GetHex()",&exp_pk_c,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_200);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xf2,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_200);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_200,&pk_c2);
  testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_pk_c","pk_c2.GetHex()",&exp_pk_c,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_200);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xf3,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_200);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_200,&pk_c3);
  testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_pk_c","pk_c3.GetHex()",&exp_pk_c,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_200);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xf4,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_200);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_200,&pk_c4);
  testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_pk_c","pk_c4.GetHex()",&exp_pk_c,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_200);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xf5,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_200);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_200,&pk_c5);
  testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_pk_c","pk_c5.GetHex()",&exp_pk_c,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_200);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xf6,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_200);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_200,&pk_c11);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_pk_c","pk_c11.GetHex()",&exp_pk_c,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_200);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xf7,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_200);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_200,&pk_c12);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_pk_c","pk_c12.GetHex()",&exp_pk_c,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_200);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xf8,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_200);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_200,&sk_c);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_sk_c","sk_c.GetHex()",&exp_sk_c,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_200);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xf9,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_200);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c12);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_c);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c5);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_a);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
  std::__cxx11::string::~string((string *)&exp_pk_c);
  std::__cxx11::string::~string((string *)&exp_sk_c);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_a);
  return;
}

Assistant:

TEST(SchnorrPubkey, TweakTest) {
  // https://planethouki.wordpress.com/2018/03/15/pubkey-add-ecdsa/
  Privkey sk_a("1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434");
  Privkey sk_b("353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659");
  std::string exp_sk_c = "528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d";
  std::string exp_pk_c = "c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71";
  Pubkey pk("03c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71");

  auto pk_a = SchnorrPubkey::FromPrivkey(sk_a);
  auto pk_b = SchnorrPubkey::FromPrivkey(sk_b);
  ByteData256 tweak1 = ByteData256(pk_b.GetData());

  auto pk_c1 = pk_a + tweak1;
  auto pk_c2 = pk_b;
  pk_c2 += tweak1;

  auto pk_c3 = pk_a - tweak1;
  auto pk_c4 = pk_b;
  pk_c2 -= tweak1;

  auto pk_c5 = pk_a.CreateTweakAdd(pk_b);

  auto sk_c = sk_a + sk_b;
  auto pk_c11 = SchnorrPubkey::FromPrivkey(sk_c);
  auto pk_c12 = SchnorrPubkey::FromPubkey(pk);

  EXPECT_NE(exp_pk_c, pk_c1.GetHex());  // tweak
  EXPECT_NE(exp_pk_c, pk_c2.GetHex());  // tweak
  EXPECT_NE(exp_pk_c, pk_c3.GetHex());  // tweak
  EXPECT_NE(exp_pk_c, pk_c4.GetHex());  // tweak
  EXPECT_NE(exp_pk_c, pk_c5.GetHex());  // tweak
  EXPECT_EQ(exp_pk_c, pk_c11.GetHex());  // combine
  EXPECT_EQ(exp_pk_c, pk_c12.GetHex());
  EXPECT_EQ(exp_sk_c, sk_c.GetHex());
}